

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O0

void initedog(monst *mtmp)

{
  schar sVar1;
  monst *mtmp_local;
  
  sVar1 = '\x05';
  if ((mtmp->data->mflags2 & 0x400000) != 0) {
    sVar1 = '\n';
  }
  mtmp->mtame = sVar1;
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | 0x400000;
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffff7fff;
  set_malign(mtmp);
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfeffffff;
  mtmp->meating = 0;
  *(undefined4 *)&mtmp->field_0x74 = 0;
  *(undefined4 *)&mtmp[1].nmon = 10000;
  *(undefined4 *)((long)&mtmp[1].nmon + 4) = 10;
  *(undefined4 *)&mtmp[1].data = 0;
  *(uint *)((long)&mtmp[1].data + 4) = moves + 1000;
  *(undefined1 *)((long)&mtmp[1].minvent + 4) = 0xff;
  *(undefined1 *)((long)&mtmp[1].minvent + 5) = 0xff;
  *(undefined4 *)&mtmp[1].dlevel = 0;
  *(undefined4 *)((long)&mtmp[1].dlevel + 4) = 0;
  *(undefined4 *)&mtmp[1].minvent = 0;
  *(byte *)((long)&mtmp[1].minvent + 6) = *(byte *)((long)&mtmp[1].minvent + 6) & 0xfe;
  return;
}

Assistant:

void initedog(struct monst *mtmp)
{
	mtmp->mtame = is_domestic(mtmp->data) ? 10 : 5;
	mtmp->mpeaceful = 1;
	mtmp->mavenge = 0;
	set_malign(mtmp); /* recalc alignment now that it's tamed */
	mtmp->mleashed = 0;
	mtmp->meating = 0;
	EDOG(mtmp)->droptime = 0;
	EDOG(mtmp)->dropdist = 10000;
	EDOG(mtmp)->apport = 10;
	EDOG(mtmp)->whistletime = 0;
	EDOG(mtmp)->hungrytime = 1000 + moves;
	EDOG(mtmp)->ogoal.x = -1;	/* force error if used before set */
	EDOG(mtmp)->ogoal.y = -1;
	EDOG(mtmp)->abuse = 0;
	EDOG(mtmp)->revivals = 0;
	EDOG(mtmp)->mhpmax_penalty = 0;
	EDOG(mtmp)->killed_by_u = 0;
}